

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long,wchar_t>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,unsigned_long count,
          wchar_t *value)

{
  unsigned_long __value;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *this;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_38;
  wchar_t *local_30;
  unsigned_long i;
  wchar_t *value_local;
  unsigned_long count_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  i = (unsigned_long)value;
  value_local = (wchar_t *)count;
  count_local = (unsigned_long)out.container;
  for (local_30 = (wchar_t *)0x0; __value = i, local_30 < value_local;
      local_30 = (wchar_t *)((long)local_30 + 1)) {
    local_38 = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator++
                         ((back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> *)&count_local,0)
    ;
    this = std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator*(&local_38);
    std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>::operator=
              (this,(value_type_conflict5 *)__value);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)(buffer<wchar_t> *)count_local;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}